

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O2

bool DirOpus(Disk *disk)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Sector *pSVar7;
  Data *pDVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int sector_;
  uint local_f0;
  uint local_e8;
  uint local_e4;
  string name;
  int start;
  undefined4 uStack_8c;
  char local_80 [20];
  Format fmt;
  
  Format::Format(&fmt,OPD);
  sector_ = 0;
  local_f0 = 1;
  iVar14 = 0;
  iVar6 = 0;
  local_e8 = local_f0;
  local_e4 = local_f0;
  do {
    if ((int)local_f0 < sector_) {
      return true;
    }
    Header::Header((Header *)&name,0,0,sector_,1);
    pSVar7 = Disk::get_sector(disk,(Header *)&name);
    pDVar8 = Sector::data_copy(pSVar7,0);
    puVar1 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sector_ == 0) {
      local_e4 = (uint)puVar1[2];
      local_e8 = (uint)puVar1[3];
      Format::Validate(local_e4,2 - (uint)((puVar1[4] & 0x10) == 0),local_e8,0x200,0);
    }
    else {
      iVar4 = Format::sector_size(&fmt);
      iVar4 = iVar4 / 0x10;
      iVar9 = 0;
      if (0 < iVar4) {
        iVar9 = iVar4;
      }
      iVar5 = iVar6 + iVar9;
      lVar12 = 0;
      iVar3 = iVar6;
      while( true ) {
        iVar6 = iVar5;
        if (iVar9 << 4 == (int)lVar12) break;
        uVar13 = (uint)puVar1[lVar12 + 2] | (puVar1[lVar12 + 3] & 0xf) << 8;
        if (*(ushort *)(puVar1 + lVar12 + 4) == 0xffff) {
          iVar6 = Format::sector_size(&fmt);
          util::fmt_abi_cxx11_
                    (&name,"\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                     (ulong)(iVar3 - 1),(ulong)(local_f0 * iVar4 - (iVar3 + 1)),(ulong)(iVar14 + 1),
                     (ulong)(uVar13 - iVar14),(int)(uVar13 - iVar14) / (int)(0x400 / (long)iVar6));
          util::operator<<((LogHelper *)&util::cout,&name);
          std::__cxx11::string::~string((string *)&name);
          return true;
        }
        uVar11 = *(ushort *)(puVar1 + lVar12 + 4) - uVar13;
        if ((int)lVar12 == 0 && sector_ == 1) {
          _start = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&start,puVar1 + lVar12 + 6,puVar1 + lVar12 + 0x10);
          util::trim(&name,(string *)&start);
          std::__cxx11::string::~string((string *)&start);
          util::fmt_abi_cxx11_
                    ((string *)&start,"%.10s:\n\n",
                     CONCAT71(name._M_dataplus._M_p._1_7_,name._M_dataplus._M_p._0_1_));
          util::operator<<((LogHelper *)&util::cout,(string *)&start);
          std::__cxx11::string::~string((string *)&start);
          std::__cxx11::string::~string((string *)&name);
          local_f0 = uVar11;
          goto LAB_00156ec4;
        }
        util::fmt_abi_cxx11_(&name,"%-10.10s  ");
        util::operator<<((LogHelper *)&util::cout,&name);
        std::__cxx11::string::~string((string *)&name);
        uVar10 = (ulong)(uVar13 + 1) / (ulong)local_e8;
        Header::Header((Header *)&name,(int)(uVar10 % (ulong)local_e4),(int)(uVar10 / local_e4),
                       (uVar13 + 1) % local_e8 + fmt.base,1);
        pSVar7 = Disk::get_sector(disk,(Header *)&name);
        pDVar8 = Sector::data_copy(pSVar7,0);
        puVar2 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (ulong)*(ushort *)(puVar2 + 1);
        start = (uint)*(ushort *)(puVar2 + 3);
        switch(*puVar2) {
        case '\0':
          util::operator<<((LogHelper *)&util::cout,(char (*) [8])"BASIC  ");
          if (start < 10000) {
            util::operator<<((LogHelper *)&util::cout,&start);
          }
          goto LAB_00156eb4;
        case '\x01':
          util::fmt_abi_cxx11_(&name,"DATA   %c()",(ulong)((puVar2[4] & 0x3f) + 0x60),uVar10);
          util::operator<<((LogHelper *)&util::cout,&name);
          break;
        case '\x02':
          util::fmt_abi_cxx11_(&name,"DATA   %c$()",(ulong)((puVar2[4] & 0x3f) + 0x60),uVar10);
          util::operator<<((LogHelper *)&util::cout,&name);
          break;
        case '\x03':
          util::fmt_abi_cxx11_(&name,"CODE   %5u,%u",(ulong)(uint)*(ushort *)(puVar2 + 3),uVar10);
          util::operator<<((LogHelper *)&util::cout,&name);
          break;
        default:
          util::operator<<((LogHelper *)&util::cout,(char (*) [4])"???");
          goto LAB_00156eb4;
        }
        std::__cxx11::string::~string((string *)&name);
LAB_00156eb4:
        name._M_dataplus._M_p._0_1_ = 10;
        util::operator<<((LogHelper *)&util::cout,(char *)&name);
LAB_00156ec4:
        iVar14 = iVar14 + uVar11 + 1;
        lVar12 = lVar12 + 0x10;
        iVar3 = iVar3 + 1;
      }
    }
    sector_ = sector_ + 1;
  } while( true );
}

Assistant:

bool DirOpus(Disk& disk)
{
    Format fmt{ RegularFormat::OPD };

    auto cyls = 1, heads = 1, sectors = 1;
    auto uFiles = 0, uBlocks = 0;
    auto cat_blocks = 1;

    for (auto i = 0; i <= cat_blocks; ++i)
    {
        auto& sector = disk.get_sector(Header(0, 0, i, 1));
        auto& data = sector.data_copy();

        // First sector has disk geometry
        if (i == 0)
        {
            auto& ob = *reinterpret_cast<const OPD_BOOT*>(data.data());
            cyls = ob.cyls;
            heads = (ob.flags & 0x10) ? 2 : 1;
            sectors = ob.sectors;

            Format::Validate(cyls, heads, sectors);
            continue;
        }

        auto pd = reinterpret_cast<const OPUS_DIR*>(data.data());
        auto dir_entries = fmt.sector_size() / static_cast<int>(sizeof(OPUS_DIR));

        for (auto j = 0; j < dir_entries; ++j, ++pd)
        {
            // Extract the catalogue entry contents
            auto uFirstBlock = ((pd->first_block[1] & 0x0f) << 8) | pd->first_block[0];
            auto uLastBlock = (pd->last_block[1] << 8) | pd->last_block[0];
            //          auto uLastBlockSize = (pd->last_block_size[1] << 8) | pd->last_block_size[0];   // unused here

                        // Directory terminator?
            if (uLastBlock == 0xffff)
            {
                // Don't include catalogue and end marker in file count
                util::cout << util::fmt("\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                    uFiles - 1, cat_blocks * dir_entries - uFiles - 1, uBlocks + 1,
                    uFirstBlock - uBlocks, (uFirstBlock - uBlocks) / (1024 / fmt.sector_size()));
                return true;
            }

            ++uFiles;
            uBlocks += uLastBlock - uFirstBlock + 1;

            // The first entry in the catalogue is the label
            if (i == 1 && !j)
            {
                auto name = util::trim(std::string(pd->szName, sizeof(pd->szName)));
                util::cout << util::fmt("%.10s:\n\n", name.c_str());

                // Update the real number of blocks in the catalogue
                // The first block isn't directory, so subtract an extra 1
                cat_blocks = uLastBlock - uFirstBlock + 1 - 1;
                continue;
            }

            // Output the filename (we don't expand keywords yet)
            util::cout << util::fmt("%-10.10s  ", pd->szName);

            // ToDo: suppress extra info on physical disks, due to seek overhead?
//          if (true)
            {
                // Locate the first sector of the file, which starts with a header
                auto cyl = (++uFirstBlock / sectors) % cyls;
                auto head = (uFirstBlock / sectors) / cyls;
                auto sec = (uFirstBlock % sectors) + fmt.base;

                auto& sectorS = disk.get_sector(Header(cyl, head, sec, 1));
                auto& dataS = sectorS.data_copy();

                // Extract the file type, start and length
                auto type = dataS[0];
                auto length = (dataS[2] << 8) | dataS[1];
                auto start = (dataS[4] << 8) | dataS[3];
                //              auto uUnk = (dataS[6] << 8) | dataS[5];

                                // Display type-dependent information
                switch (type)
                {
                case 0: util::cout << "BASIC  "; if (start < 10000) util::cout << start; break;
                case 1: util::cout << util::fmt("DATA   %c()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 2: util::cout << util::fmt("DATA   %c$()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 3: util::cout << util::fmt("CODE   %5u,%u", start, length); break;
                default: util::cout << "???"; break;
                }
            }

            util::cout << '\n';
        }
    }

    return true;
}